

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Parser::parseIntoTokens
          (Parser *this,int argc,char **argv,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  long in_RDX;
  int in_ESI;
  int i;
  string doubleDash;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
  *in_stack_00000100;
  string *in_stack_00000108;
  Parser *in_stack_00000110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  allocator *in_stack_ffffffffffffff60;
  bool local_91;
  allocator local_79;
  string local_78 [32];
  int local_58;
  allocator local_41;
  string local_40 [40];
  long local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"--",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_58 = 1;
  while( true ) {
    local_91 = false;
    if (local_58 < local_c) {
      local_91 = std::operator!=((char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    if (local_91 == false) break;
    in_stack_ffffffffffffff58 =
         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
          (local_18 + (long)local_58 * 8);
    in_stack_ffffffffffffff60 = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_78,(char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
    parseIntoTokens(in_stack_00000110,in_stack_00000108,in_stack_00000100);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    local_58 = local_58 + 1;
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void parseIntoTokens( int argc, char const * const * argv, std::vector<Parser::Token>& tokens ) const {
            const std::string doubleDash = "--";
            for( int i = 1; i < argc && argv[i] != doubleDash; ++i )
                parseIntoTokens( argv[i] , tokens);
        }